

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example6.cpp
# Opt level: O2

int main(void)

{
  in_addr_t iVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  uint16_t destport;
  uint16_t portbase;
  int num;
  RTPTime RStack_10930;
  string ipstr;
  RTPUDPv4TransmissionParams RStack_10908;
  RTPSessionParams sessparams;
  RTPIPv4Address addr;
  MyRTPSession sess;
  
  MyRTPSession::MyRTPSession(&sess);
  ipstr._M_dataplus._M_p = (pointer)&ipstr.field_2;
  ipstr._M_string_length = 0;
  ipstr.field_2._M_local_buf[0] = '\0';
  poVar3 = std::operator<<((ostream *)&std::cout,"Using version ");
  RStack_10908.super_RTPTransmissionParams._0_12_ = jrtplib::RTPLibraryVersion::GetVersion();
  jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_
            ((string *)&sessparams,(RTPLibraryVersion *)&RStack_10908);
  poVar3 = std::operator<<(poVar3,(string *)&sessparams);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&sessparams);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter local portbase:");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter the destination IP address");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator>>((istream *)&std::cin,(string *)&ipstr);
  iVar1 = inet_addr(ipstr._M_dataplus._M_p);
  if (iVar1 == 0xffffffff) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Bad IP address specified");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = -1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Enter the destination port");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar3 = std::operator<<((ostream *)&std::cout,"Number of packets you wish to be sent:");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::istream::operator>>((istream *)&std::cin,&num);
    RStack_10908.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)((long)&RStack_10908 + 0x18);
    RStack_10908.super_RTPTransmissionParams._0_12_ = ZEXT812(0x144050);
    RStack_10908.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    _M_node._M_size = 0;
    RStack_10908.super_RTPTransmissionParams._12_2_ = 5000;
    RStack_10908.bindIP = 0;
    RStack_10908.mcastifaceIP = 0;
    RStack_10908.multicastTTL = '\x01';
    RStack_10908.rtpsendbuf = 0x8000;
    RStack_10908.rtprecvbuf = 0x8000;
    RStack_10908.rtcpsendbuf = 0x8000;
    RStack_10908.rtcprecvbuf = 0x8000;
    RStack_10908.m_pAbortDesc = (RTPAbortDescriptors *)0x0;
    RStack_10908.rtcpmux = false;
    RStack_10908._69_4_ = 0;
    RStack_10908.rtpsock._1_3_ = 0;
    RStack_10908.rtcpsock = 0;
    RStack_10908.useexistingsockets = false;
    RStack_10908.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    _M_node.super__List_node_base._M_prev =
         RStack_10908.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         ._M_node.super__List_node_base._M_next;
    jrtplib::RTPSessionParams::RTPSessionParams(&sessparams);
    sessparams.owntsunit = 0.1;
    sessparams.acceptown = true;
    RStack_10908.rtcpmux = true;
    iVar2 = jrtplib::RTPSession::Create
                      (&sess.super_RTPSession,&sessparams,&RStack_10908.super_RTPTransmissionParams,
                       IPv4UDPProto);
    checkerror(iVar2);
    addr.super_RTPAddress.addresstype = IPv4Address;
    addr.super_RTPAddress._12_4_ =
         iVar1 >> 0x18 | (iVar1 & 0xff0000) >> 8 | (iVar1 & 0xff00) << 8 | iVar1 << 0x18;
    addr.super_RTPAddress._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_00144d00;
    iVar2 = jrtplib::RTPSession::AddDestination(&sess.super_RTPSession,&addr.super_RTPAddress);
    checkerror(iVar2);
    uVar4 = 1;
    while( true ) {
      if (num < (int)uVar4) break;
      printf("\nSending packet %d/%d\n",(ulong)uVar4);
      iVar2 = jrtplib::RTPSession::SendPacket(&sess.super_RTPSession,"1234567890",10,'\0',false,10);
      checkerror(iVar2);
      iVar2 = jrtplib::RTPSession::Poll(&sess.super_RTPSession);
      checkerror(iVar2);
      RStack_10930.m_t = 1.0;
      jrtplib::RTPTime::Wait(&RStack_10930);
      uVar4 = uVar4 + 1;
    }
    RStack_10930.m_t = 10.0;
    iVar2 = 0;
    jrtplib::RTPSession::BYEDestroy(&sess.super_RTPSession,&RStack_10930,(void *)0x0,0);
    std::__cxx11::string::~string((string *)&sessparams.cname);
    jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams(&RStack_10908);
  }
  std::__cxx11::string::~string((string *)&ipstr);
  jrtplib::RTPSession::~RTPSession(&sess.super_RTPSession);
  return iVar2;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyRTPSession sess;
	uint16_t portbase,destport;
	uint32_t destip;
	std::string ipstr;
	int status,i,num;

	std::cout << "Using version " << RTPLibraryVersion::GetVersion().GetVersionString() << std::endl;

	// First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << "Enter the destination IP address" << std::endl;
	std::cin >> ipstr;

	destip = inet_addr(ipstr.c_str());
	if (destip == INADDR_NONE)
	{
		std::cerr << "Bad IP address specified" << std::endl;
		return -1;
	}
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	std::cout << "Enter the destination port" << std::endl;
	std::cin >> destport;
	
	std::cout << std::endl;
	std::cout << "Number of packets you wish to be sent:" << std::endl;
	std::cin >> num;

	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	
	// Let's also use RTCP multiplexing for this example
	transparams.SetRTCPMultiplexing(true); 

	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	// We're assuming that the destination is also using RTCP multiplexing 
	// ('true' means that the same port will be used for RTCP)
	RTPIPv4Address addr(destip,destport,true); 
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);

		// Either the background thread or the poll function itself will
		// cause the OnValidatedRTPPacket and OnRTCPSDESItem functions to
		// be called, so in this loop there's not much left to do. 
		
#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}